

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

void __thiscall cmUVProcessChain::cmUVProcessChain(cmUVProcessChain *this)

{
  cmUVProcessChain *this_local;
  
  std::make_unique<cmUVProcessChain::InternalData>();
  return;
}

Assistant:

cmUVProcessChain::cmUVProcessChain()
  : Data(cm::make_unique<InternalData>())
{
}